

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O2

parser_error parse_race_relations_dislike(parser *p)

{
  undefined8 uVar1;
  wchar_t wVar2;
  parser_error pVar3;
  void *pvVar4;
  char *pcVar5;
  player_race *ppVar6;
  undefined8 *puVar7;
  
  pvVar4 = parser_priv(p);
  pcVar5 = parser_getsym(p,"name");
  ppVar6 = player_race_from_name(pcVar5);
  if (pvVar4 == (void *)0x0) {
    pVar3 = PARSE_ERROR_MISSING_RECORD_HEADER;
  }
  else if (ppVar6 == (player_race *)0x0) {
    pVar3 = PARSE_ERROR_INVALID_PLAY_RACE_NAME;
  }
  else {
    uVar1 = *(undefined8 *)((long)pvVar4 + 0x10);
    puVar7 = (undefined8 *)mem_zalloc(0x20);
    *(undefined8 **)((long)pvVar4 + 0x10) = puVar7;
    *puVar7 = uVar1;
    puVar7[2] = ppVar6;
    pcVar5 = string_make(pcVar5);
    *(char **)(*(long *)((long)pvVar4 + 0x10) + 8) = pcVar5;
    wVar2 = parser_getint(p,"rel");
    *(wchar_t *)(*(long *)((long)pvVar4 + 0x10) + 0x18) = wVar2;
    pVar3 = PARSE_ERROR_NONE;
  }
  return pVar3;
}

Assistant:

static enum parser_error parse_race_relations_dislike(struct parser *p) {
	struct player_race *r = parser_priv(p);
	const char *name = parser_getsym(p, "name");
	struct player_race *d = player_race_from_name(name);
	struct player_race_list *list;

	if (!r)
		return PARSE_ERROR_MISSING_RECORD_HEADER;
	if (!d)
		return PARSE_ERROR_INVALID_PLAY_RACE_NAME;
	list = r->dislikes;
	r->dislikes = mem_zalloc(sizeof(struct player_race_list));
	r->dislikes->next = list;
	r->dislikes->race = d;
	r->dislikes->name = string_make(name);
	r->dislikes->rel = parser_getint(p, "rel");
	return PARSE_ERROR_NONE;
}